

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::MultAdd
          (TPZSkylMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *x
          ,TPZFMatrix<std::complex<long_double>_> *y,TPZFMatrix<std::complex<long_double>_> *z,
          complex<long_double> alpha,complex<long_double> beta,int opt)

{
  long lVar1;
  complex<long_double> **ppcVar2;
  complex<long_double> *pcVar3;
  long lVar4;
  ostream *poVar5;
  long lVar6;
  complex<long_double> *pcVar7;
  complex<long_double> *pcVar8;
  complex<long_double> *pcVar9;
  longdouble *plVar10;
  longdouble lVar11;
  longdouble lVar12;
  complex<long_double> val;
  complex<long_double> __r_4;
  complex<long_double> local_128;
  complex<long_double> local_108;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  TPZFMatrix<std::complex<long_double>_> *local_c0;
  complex<long_double> local_b8;
  long local_90;
  TPZFMatrix<std::complex<long_double>_> *local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  undefined1 local_58 [40];
  
  if (((opt == 0) &&
      ((this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol !=
       (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow)) ||
     ((this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow !=
      (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<std::complex<long_double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<long double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<long double>]"
               ," <matrixs with incompatible dimensions>");
  }
  lVar1 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  if (((z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow != lVar1) ||
     ((z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol !=
      (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol)) {
    (*(z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xe])
              (z,lVar1,(x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol);
  }
  lVar1 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  if (((lVar1 != (y->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol) ||
      (lVar1 != (z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol)) ||
     ((lVar1 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow,
      lVar1 != (y->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow ||
      (lVar1 != (z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x.Cols = ",9);
    poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," y.Cols()",9);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," z.Cols() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," x.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," y.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," z.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    TPZMatrix<std::complex<long_double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<long double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<long double>]"
               ," incompatible dimensions\n");
  }
  local_88 = z;
  TPZMatrix<std::complex<long_double>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<long_double>_>,y,z,beta,opt);
  local_90 = (x->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  if (0 < local_90) {
    local_d0 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
    local_d8 = 0;
    local_80 = 0;
    local_c0 = x;
    do {
      if (0 < local_d0) {
        local_c8 = 0x30;
        local_e0 = 0;
        do {
          lVar1 = local_80;
          ppcVar2 = (this->fElem).fStore;
          local_60 = (long)ppcVar2[local_e0 + 1] - (long)ppcVar2[local_e0];
          local_78 = local_60 >> 5;
          local_108._M_value._0_8_ = SUB108((longdouble)0,0);
          local_108._M_value._8_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
          local_68 = local_e0 - local_78;
          local_70 = local_68 + 1;
          pcVar8 = local_c0->fElem +
                   (local_c0->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                   * local_80 + local_70;
          pcVar3 = (this->fElem).fStore[local_e0];
          pcVar7 = (complex<long_double> *)((long)pcVar3 + local_60);
          local_108._M_value._16_8_ = local_108._M_value._0_8_;
          local_108._M_value._24_2_ = local_108._M_value._8_2_;
          while (pcVar9 = pcVar7 + -1, pcVar3 < pcVar9) {
            if (opt == 0) {
              local_128._M_value._0_8_ = SUB108(*(unkbyte10 *)pcVar9->_M_value,0);
              local_128._M_value._8_2_ = SUB102((unkuint10)*(unkbyte10 *)pcVar9->_M_value >> 0x40,0)
              ;
              local_128._M_value._16_8_ = SUB108(-*(longdouble *)(pcVar7[-1]._M_value + 0x10),0);
              local_128._M_value._24_2_ =
                   SUB102((unkuint10)-*(longdouble *)(pcVar7[-1]._M_value + 0x10) >> 0x40,0);
            }
            else {
              local_128._M_value._0_8_ = *(undefined8 *)pcVar9->_M_value;
              local_128._M_value._16_8_ = *(undefined8 *)(pcVar7[-1]._M_value + 0x10);
              local_128._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar7[-1]._M_value + 0x18),0);
              local_128._M_value._26_6_ =
                   SUB86((ulong)*(undefined8 *)(pcVar7[-1]._M_value + 0x18) >> 0x10,0);
              local_128._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar7[-1]._M_value + 8),0);
              local_128._M_value._10_6_ =
                   SUB86((ulong)*(undefined8 *)(pcVar7[-1]._M_value + 8) >> 0x10,0);
            }
            std::complex<long_double>::operator*=(&local_128,pcVar8);
            lVar12 = (longdouble)CONCAT28(local_108._M_value._8_2_,local_108._M_value._0_8_) +
                     (longdouble)CONCAT28(local_128._M_value._8_2_,local_128._M_value._0_8_);
            lVar11 = (longdouble)CONCAT28(local_108._M_value._24_2_,local_108._M_value._16_8_) +
                     (longdouble)CONCAT28(local_128._M_value._24_2_,local_128._M_value._16_8_);
            local_108._M_value._0_8_ = SUB108(lVar12,0);
            local_108._M_value._8_2_ = SUB102((unkuint10)lVar12 >> 0x40,0);
            local_108._M_value._16_8_ = SUB108(lVar11,0);
            local_108._M_value._24_2_ = SUB102((unkuint10)lVar11 >> 0x40,0);
            pcVar8 = pcVar8 + 1;
            pcVar7 = pcVar9;
          }
          if (pcVar9 == pcVar3) {
            local_128._M_value._0_8_ = *(undefined8 *)pcVar9->_M_value;
            local_128._M_value._16_8_ = *(undefined8 *)(pcVar7[-1]._M_value + 0x10);
            local_128._M_value._24_2_ = SUB82(*(undefined8 *)(pcVar7[-1]._M_value + 0x18),0);
            local_128._M_value._26_6_ =
                 SUB86((ulong)*(undefined8 *)(pcVar7[-1]._M_value + 0x18) >> 0x10,0);
            local_128._M_value._8_2_ = SUB82(*(undefined8 *)(pcVar7[-1]._M_value + 8),0);
            local_128._M_value._10_6_ =
                 SUB86((ulong)*(undefined8 *)(pcVar7[-1]._M_value + 8) >> 0x10,0);
            std::complex<long_double>::operator*=(&local_128,pcVar8);
            lVar12 = (longdouble)CONCAT28(local_108._M_value._8_2_,local_108._M_value._0_8_) +
                     (longdouble)CONCAT28(local_128._M_value._8_2_,local_128._M_value._0_8_);
            lVar11 = (longdouble)CONCAT28(local_108._M_value._24_2_,local_108._M_value._16_8_) +
                     (longdouble)CONCAT28(local_128._M_value._24_2_,local_128._M_value._16_8_);
            local_108._M_value._0_8_ = SUB108(lVar12,0);
            local_108._M_value._8_2_ = SUB102((unkuint10)lVar12 >> 0x40,0);
            local_108._M_value._16_8_ = SUB108(lVar11,0);
            local_108._M_value._24_2_ = SUB102((unkuint10)lVar11 >> 0x40,0);
          }
          local_128._M_value._16_8_ = local_108._M_value._16_8_;
          local_128._M_value._24_2_ = local_108._M_value._24_2_;
          local_128._M_value._26_6_ = local_108._M_value._26_6_;
          local_128._M_value._0_8_ = local_108._M_value._0_8_;
          local_128._M_value._8_2_ = local_108._M_value._8_2_;
          local_128._M_value._10_6_ = local_108._M_value._10_6_;
          std::complex<long_double>::operator*=(&local_128,&alpha);
          lVar4 = local_e0;
          if (((local_88->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <=
               local_e0) ||
             ((local_88->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <=
              lVar1)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (local_88->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow *
                  lVar1;
          pcVar7 = local_88->fElem;
          lVar11 = *(longdouble *)(pcVar7[lVar6 + local_e0]._M_value + 0x10);
          *(longdouble *)pcVar7[lVar6 + local_e0]._M_value =
               *(longdouble *)pcVar7[lVar6 + local_e0]._M_value +
               (longdouble)CONCAT28(local_128._M_value._8_2_,local_128._M_value._0_8_);
          *(longdouble *)(pcVar7[lVar6 + local_e0]._M_value + 0x10) =
               lVar11 + (longdouble)CONCAT28(local_128._M_value._24_2_,local_128._M_value._16_8_);
          if (((local_68 < -1) ||
              ((local_88->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <=
               local_70)) ||
             ((local_88->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <=
              lVar1)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (local_88->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
          pcVar7 = local_88->fElem;
          (*(local_c0->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0x24])(&local_128,local_c0,local_e0,lVar1);
          local_108._M_value._16_8_ = local_128._M_value._16_8_;
          local_108._M_value._24_2_ = local_128._M_value._24_2_;
          local_108._M_value._26_6_ = local_128._M_value._26_6_;
          local_108._M_value._0_8_ = local_128._M_value._0_8_;
          local_108._M_value._8_2_ = local_128._M_value._8_2_;
          local_108._M_value._10_6_ = local_128._M_value._10_6_;
          pcVar8 = (complex<long_double> *)((this->fElem).fStore[lVar4][-1]._M_value + local_60);
          if (pcVar3 < pcVar8) {
            plVar10 = (longdouble *)(pcVar7[-local_78]._M_value + lVar6 * local_d8 + local_c8);
            do {
              pcVar7 = pcVar8;
              if (opt != 0) {
                local_58._0_10_ = *(unkbyte10 *)pcVar8->_M_value;
                local_58._16_10_ = -*(longdouble *)(pcVar8->_M_value + 0x10);
                pcVar7 = (complex<long_double> *)local_58;
              }
              local_b8._M_value._24_8_ = alpha._M_value._24_8_;
              local_b8._M_value._16_8_ = alpha._M_value._16_8_;
              local_b8._M_value._8_8_ = alpha._M_value._8_8_;
              local_b8._M_value._0_8_ = alpha._M_value._0_8_;
              std::complex<long_double>::operator*=(&local_b8,pcVar7);
              local_128._M_value._0_8_ = local_b8._M_value._0_8_;
              local_128._M_value._8_2_ = local_b8._M_value._8_2_;
              local_128._M_value._10_6_ = local_b8._M_value._10_6_;
              local_128._M_value._16_8_ = local_b8._M_value._16_8_;
              local_128._M_value._24_2_ = local_b8._M_value._24_2_;
              local_128._M_value._26_6_ = local_b8._M_value._26_6_;
              std::complex<long_double>::operator*=(&local_128,&local_108);
              plVar10[-1] = plVar10[-1] +
                            (longdouble)CONCAT28(local_128._M_value._8_2_,local_128._M_value._0_8_);
              *plVar10 = *plVar10 +
                         (longdouble)CONCAT28(local_128._M_value._24_2_,local_128._M_value._16_8_);
              pcVar8 = pcVar8 + -1;
              plVar10 = plVar10 + 2;
            } while (pcVar3 < pcVar8);
          }
          local_e0 = local_e0 + 1;
          local_c8 = local_c8 + 0x20;
        } while (local_e0 != local_d0);
      }
      local_80 = local_80 + 1;
      local_d8 = local_d8 + 0x20;
    } while (local_80 != local_90);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}